

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::setup(xr_bone *this,uint16_t id,xr_object *object)

{
  ulong uVar1;
  xr_bone *pxVar2;
  xr_bone *local_28;
  xr_object *local_20;
  xr_object *object_local;
  xr_bone *pxStack_10;
  uint16_t id_local;
  xr_bone *this_local;
  
  this->m_id = id;
  local_20 = object;
  object_local._6_2_ = id;
  pxStack_10 = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pxVar2 = xr_object::find_bone(local_20,&this->m_parent_name);
    this->m_parent = pxVar2;
    if (this->m_parent == (xr_bone *)0x0) {
      std::__cxx11::string::clear();
    }
    else {
      local_28 = this;
      std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::push_back
                (&this->m_parent->m_children,&local_28);
    }
  }
  return;
}

Assistant:

void xr_bone::setup(uint16_t id, xr_object& object)
{
	m_id = id;
	if (!m_parent_name.empty()) {
		m_parent = object.find_bone(m_parent_name);
		
		if (m_parent)
			m_parent->m_children.push_back(this);
		else
			m_parent_name.clear();
	}
}